

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O3

unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
* __thiscall
LinkedReadsDatastore::get_tags_kmers
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *__return_storage_ptr__,LinkedReadsDatastore *this,int k,int min_tag_cov,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *tags,
          ReadSequenceBuffer *blrsg)

{
  byte bVar1;
  pointer puVar2;
  uint64_t *puVar3;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var4;
  _Rb_tree_node_base *p_Var5;
  byte *pbVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  uint64_t *puVar9;
  char *s;
  pointer puVar10;
  unsigned_long *puVar11;
  _Rb_tree_header *p_Var12;
  long lVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> all_kmers;
  vector<unsigned_long,_std::allocator<unsigned_long>_> read_ids;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  kset;
  StreamKmerFactory skf;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2f8;
  uint64_t *local_2d8;
  uint64_t *puStack_2d0;
  long local_2c8;
  int local_2bc;
  ulong local_2b8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2b0;
  ReadSequenceBuffer *local_2a8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2a0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_298;
  byte local_260;
  long local_258;
  unsigned_long uStack_250;
  unsigned_long local_248;
  ulong local_240;
  long local_238;
  char local_230 [65];
  undefined1 local_1ef;
  undefined1 local_1ed;
  undefined1 local_1e9;
  undefined1 local_1dc;
  undefined1 local_1cf;
  undefined1 local_1cd;
  undefined1 local_1c9;
  undefined1 local_1bc;
  undefined8 local_138;
  char local_130 [65];
  undefined1 local_ef;
  undefined1 local_ed;
  undefined1 local_e9;
  undefined1 local_dc;
  undefined1 local_cf;
  undefined1 local_cd;
  undefined1 local_c9;
  undefined1 local_bc;
  undefined8 local_38;
  
  local_260 = (byte)k;
  local_240 = ~(-1L << ((byte)(k * 2) & 0x3f));
  local_258 = 0;
  uStack_250 = 0;
  lVar13 = 0;
  local_248 = 0;
  local_238 = (ulong)(k * 2 & 0x1fe) - 2;
  local_138 = 0;
  local_38 = 0;
  local_2bc = min_tag_cov;
  local_2b0 = &__return_storage_ptr__->_M_h;
  local_2a8 = blrsg;
  memset(local_230,4,0xff);
  memset(local_130,4,0xff);
  local_1ef = 0;
  local_1cf = 0;
  local_1ed = 1;
  local_1cd = 1;
  local_1e9 = 2;
  local_1c9 = 2;
  local_1dc = 3;
  local_1bc = 3;
  local_ef = 3;
  local_cf = 3;
  local_ed = 2;
  local_cd = 2;
  local_e9 = 1;
  local_c9 = 1;
  local_dc = 0;
  local_bc = 0;
  local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_2c8 = 0;
  local_2d8 = (uint64_t *)0x0;
  puStack_2d0 = (uint64_t *)0x0;
  p_Var5 = (tags->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var12 = &(tags->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var12) {
    local_2b8 = (ulong)(uint)k;
    do {
      get_tag_reads((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298,this,
                    p_Var5[1]._M_color);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_2d8,puStack_2d0,
                 local_298._M_buckets,local_298._M_bucket_count);
      if (local_298._M_buckets != (__buckets_ptr)0x0) {
        operator_delete(local_298._M_buckets,
                        (long)local_298._M_before_begin._M_nxt - (long)local_298._M_buckets);
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var12);
    lVar13 = (long)puStack_2d0 - (long)local_2d8 >> 3;
    k = (int)local_2b8;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&local_2f8,((this->readsize - (long)k) + 1) * lVar13);
  puVar3 = puStack_2d0;
  if (local_2d8 != puStack_2d0) {
    puVar9 = local_2d8;
    do {
      pbVar6 = (byte *)ReadSequenceBuffer::get_read_sequence(local_2a8,*puVar9);
      local_258 = 0;
      uStack_250 = 0;
      local_248 = 0;
      while( true ) {
        bVar1 = *pbVar6;
        if ((bVar1 == 0) || (bVar1 == 10)) break;
        local_248 = local_248 * 4;
        if ((long)local_230[bVar1] == 4) {
          uStack_250 = (3L << ((byte)local_238 & 0x3f)) + (uStack_250 >> 2);
          local_258 = 0;
        }
        else {
          local_248 = local_248 + (long)local_230[bVar1];
          uStack_250 = ((long)local_130[bVar1] << ((byte)local_238 & 0x3f)) + (uStack_250 >> 2);
          local_258 = local_258 + 1;
        }
        local_248 = local_248 & local_240;
        if ((long)(ulong)local_260 <= local_258) {
          if (local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            puVar8 = &local_248;
            if (uStack_250 <= local_248) {
              puVar8 = &uStack_250;
            }
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_2f8,
                       (iterator)
                       local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,puVar8);
          }
          else {
            uVar7 = local_248;
            if (uStack_250 < local_248) {
              uVar7 = uStack_250;
            }
            *local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = uVar7;
            local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
        }
        pbVar6 = pbVar6 + 1;
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar3);
  }
  puVar2 = local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar10 = local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar8 = local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar7 = (long)local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar13 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar10,puVar2);
    puVar8 = local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  local_298._M_buckets = &local_298._M_single_bucket;
  local_298._M_bucket_count = 1;
  local_298._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_298._M_element_count = 0;
  local_298._M_rehash_policy._M_max_load_factor = 1.0;
  local_298._M_rehash_policy._M_next_resize = 0;
  local_298._M_single_bucket = (__node_base_ptr)0x0;
  if (local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start < puVar8) {
    lVar13 = (long)local_2bc;
    puVar10 = local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      puVar11 = puVar10;
      do {
        if (*puVar11 != *puVar10) break;
        puVar11 = puVar11 + 1;
      } while (puVar11 < puVar8);
      if (lVar13 <= (long)puVar11 - (long)puVar10 >> 3) {
        local_2a0 = &local_298;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_298,puVar10,&local_2a0);
        puVar8 = local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      }
      puVar10 = puVar11;
    } while (puVar11 < puVar8);
  }
  p_Var4 = local_2b0;
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(local_2b0,&local_298,&local_298);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_298);
  if (local_2d8 != (uint64_t *)0x0) {
    operator_delete(local_2d8,local_2c8 - (long)local_2d8);
  }
  if (local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *)p_Var4;
}

Assistant:

std::unordered_set<uint64_t> LinkedReadsDatastore::get_tags_kmers(int k, int min_tag_cov, std::set<LinkedTag> tags, ReadSequenceBuffer & blrsg) {
    class StreamKmerFactory : public  KMerFactory {
    public:
        explicit StreamKmerFactory(uint8_t k) : KMerFactory(k){}
        inline void produce_all_kmers(const char * seq, std::vector<uint64_t> &mers){
            // TODO: Adjust for when K is larger than what fits in uint64_t!
            last_unknown=0;
            fkmer=0;
            rkmer=0;
            auto s=seq;
            while (*s!='\0' and *s!='\n') {
                //fkmer: grows from the right (LSB)
                //rkmer: grows from the left (MSB)
                fillKBuf(*s, fkmer, rkmer, last_unknown);
                if (last_unknown >= K) {
                    if (fkmer <= rkmer) {
                        // Is fwd
                        mers.emplace_back(fkmer);
                    } else {
                        // Is bwd
                        mers.emplace_back(rkmer);
                    }
                }
                ++s;
            }
        }
    };
    StreamKmerFactory skf(k);

    //reserve space by counting reads first, save only the integer, do not merge just count and insert in the set
    std::vector<uint64_t> all_kmers;
    std::vector<uint64_t> read_ids;
    for (auto t:tags) {
        auto reads=get_tag_reads(t);
        read_ids.insert(read_ids.end(),reads.begin(),reads.end());
    }
    all_kmers.reserve(read_ids.size()*(readsize-k+1));
    for (auto rid:read_ids){
            skf.produce_all_kmers(blrsg.get_read_sequence(rid),all_kmers);
    }
    std::sort(all_kmers.begin(),all_kmers.end());
    std::unordered_set<uint64_t> kset;
    auto ri=all_kmers.begin();
    auto nri=all_kmers.begin();
    while (ri<all_kmers.end()){
        while (nri<all_kmers.end() and *nri==*ri) ++nri;
        if (nri-ri>=min_tag_cov) kset.insert(*ri);
        ri=nri;
    }
    return std::move(kset);
}